

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O3

Statement * rsg::anon_unknown_0::createStatement(GeneratorState *state)

{
  undefined **ppuVar1;
  Statement *pSVar2;
  int ndx;
  long lVar3;
  undefined **ppuVar4;
  float *pfVar5;
  float fVar6;
  float fVar7;
  float weights [4];
  float local_3c;
  float local_38 [6];
  
  local_3c = 0.0;
  pfVar5 = local_38;
  lVar3 = 0;
  ppuVar4 = &(anonymous_namespace)::chooseStatement(rsg::GeneratorState&)::statementSpecs;
  do {
    fVar6 = (float)(**(code **)((long)&(anonymous_namespace)::chooseStatement(rsg::GeneratorState&)
                                       ::statementSpecs + lVar3))(state);
    *pfVar5 = fVar6;
    local_3c = local_3c + fVar6;
    lVar3 = lVar3 + 0x10;
    pfVar5 = pfVar5 + 1;
  } while (lVar3 != 0x40);
  fVar6 = deRandom_getFloat(&state->m_random->m_rnd);
  lVar3 = 0;
  ppuVar1 = (undefined **)0x0;
  fVar7 = 0.0;
  do {
    fVar7 = fVar7 + local_38[lVar3];
    if (local_3c * fVar6 + 0.0 < fVar7) goto LAB_005a6ff4;
    if (0.0 < local_38[lVar3]) {
      ppuVar1 = ppuVar4;
    }
    lVar3 = lVar3 + 1;
    ppuVar4 = ppuVar4 + 2;
  } while (lVar3 != 4);
  ppuVar4 = (undefined **)0x0;
LAB_005a6ff4:
  if (ppuVar4 != (undefined **)0x0) {
    ppuVar1 = ppuVar4;
  }
  pSVar2 = (Statement *)(*(code *)ppuVar1[1])(state);
  return pSVar2;
}

Assistant:

Statement* createStatement (GeneratorState& state)
{
	return chooseStatement(state)->create(state);
}